

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O0

char * cmsysEncoding_DupToNarrow(wchar_t *str)

{
  size_t sVar1;
  size_t __size;
  size_t length;
  char *ret;
  wchar_t *str_local;
  
  length = 0;
  sVar1 = cmsysEncoding_wcstombs((char *)0x0,str,0);
  __size = sVar1 + 1;
  if ((__size != 0) && (length = (size_t)malloc(__size), (char *)length != (char *)0x0)) {
    *(char *)length = '\0';
    cmsysEncoding_wcstombs((char *)length,str,__size);
  }
  return (char *)length;
}

Assistant:

char* kwsysEncoding_DupToNarrow(const wchar_t* str)
{
  char* ret = NULL;
  size_t length = kwsysEncoding_wcstombs(0, str, 0) + 1;
  if(length > 0)
    {
    ret = (char*)malloc(length);
    if(ret)
      {
      ret[0] = 0;
      kwsysEncoding_wcstombs(ret, str, length);
      }
    }
  return ret;
}